

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O1

void secp256k1_modinv32_normalize_30
               (secp256k1_modinv32_signed30 *r,int32_t sign,secp256k1_modinv32_modinfo *modinfo)

{
  secp256k1_scalar *a;
  int iVar1;
  uint uVar2;
  uint uVar3;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  uint32_t uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int extraout_EDX;
  int extraout_EDX_00;
  ulong uVar10;
  long *extraout_RDX;
  long lVar11;
  secp256k1_fe *psVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  undefined4 in_register_00000034;
  secp256k1_fe *psVar17;
  ulong uVar18;
  secp256k1_fe *psVar19;
  secp256k1_fe *r_00;
  uint uVar20;
  secp256k1_modinv32_signed30 *psVar21;
  ulong uVar22;
  secp256k1_fe *r_01;
  uchar *__s;
  uint uVar23;
  ulong uVar24;
  uint uVar25;
  code *pcVar26;
  uint uVar27;
  size_t count;
  uint uVar28;
  code *pcVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int32_t cond_add;
  int32_t cond_negate;
  ulong uStack_1270;
  secp256k1_fe *psStack_1268;
  uchar auStack_1260 [4232];
  secp256k1_fe *psStack_1d8;
  code *pcStack_1d0;
  undefined8 uStack_1c8;
  secp256k1_fe *psStack_1c0;
  code *pcStack_1b8;
  code *pcStack_1b0;
  undefined1 auStack_1a8 [36];
  int iStack_184;
  int iStack_180;
  int iStack_17c;
  int iStack_178;
  int iStack_174;
  int iStack_170;
  int iStack_16c;
  undefined1 auStack_168 [48];
  code *pcStack_138;
  secp256k1_fe sStack_130;
  secp256k1_fe sStack_100;
  secp256k1_fe sStack_d0;
  ulong uStack_98;
  ulong uStack_90;
  ulong uStack_88;
  secp256k1_modinv32_signed30 *psStack_80;
  ulong uStack_78;
  code *pcStack_70;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  secp256k1_modinv32_modinfo *local_50;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  int32_t local_34;
  
  psVar17 = (secp256k1_fe *)CONCAT44(in_register_00000034,sign);
  uVar7 = r->v[0];
  uVar22 = (ulong)uVar7;
  uVar9 = r->v[3];
  uVar18 = (ulong)uVar9;
  uVar15 = r->v[4];
  uVar14 = (ulong)uVar15;
  uVar13 = r->v[5];
  uVar10 = (ulong)uVar13;
  psVar21 = (secp256k1_modinv32_signed30 *)(ulong)(uint)r->v[6];
  uVar16 = r->v[7];
  uVar6 = (ulong)uVar16;
  local_34 = r->v[8];
  lVar5 = 0;
  do {
    if (r->v[lVar5] < -0x3fffffff) {
      pcStack_70 = (code *)0x14c091;
      secp256k1_modinv32_normalize_30_cold_7();
LAB_0014c091:
      pcStack_70 = (code *)0x14c096;
      secp256k1_modinv32_normalize_30_cold_6();
      goto LAB_0014c096;
    }
    if (0x3fffffff < r->v[lVar5]) goto LAB_0014c091;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 9);
  psVar17 = (secp256k1_fe *)0x9;
  pcStack_70 = (code *)0x14bdce;
  psVar21 = r;
  local_60 = r->v[1];
  local_5c = r->v[2];
  local_58 = r->v[6];
  local_54 = sign;
  local_50 = modinfo;
  iVar1 = secp256k1_modinv32_mul_cmp_30(r,9,&modinfo->modulus,-2);
  if (iVar1 < 1) {
LAB_0014c096:
    pcStack_70 = (code *)0x14c09b;
    secp256k1_modinv32_normalize_30_cold_5();
LAB_0014c09b:
    pcStack_70 = (code *)0x14c0a0;
    secp256k1_modinv32_normalize_30_cold_4();
LAB_0014c0a0:
    pcStack_70 = (code *)0x14c0a5;
    secp256k1_modinv32_normalize_30_cold_3();
LAB_0014c0a5:
    pcStack_70 = (code *)0x14c0aa;
    secp256k1_modinv32_normalize_30_cold_2();
  }
  else {
    psVar17 = (secp256k1_fe *)0x9;
    pcStack_70 = (code *)0x14bded;
    psVar21 = r;
    iVar1 = secp256k1_modinv32_mul_cmp_30(r,9,&local_50->modulus,1);
    if (-1 < iVar1) goto LAB_0014c09b;
    uVar2 = local_34 >> 0x1f;
    uVar20 = (local_50->modulus).v[0];
    local_38 = (local_50->modulus).v[1];
    uVar3 = (uVar2 & local_38) + local_60;
    local_60 = (local_50->modulus).v[2];
    uVar8 = (uVar2 & local_60) + local_5c;
    local_5c = (local_50->modulus).v[3];
    local_3c = (local_50->modulus).v[4];
    local_40 = (local_50->modulus).v[5];
    local_44 = (local_50->modulus).v[6];
    uVar27 = (uVar2 & local_44) + local_58;
    local_58 = (local_50->modulus).v[7];
    local_64 = (int)local_54 >> 0x1f;
    local_54 = (local_50->modulus).v[8];
    uVar25 = ((uVar2 & uVar20) + uVar7 ^ local_64) - local_64;
    uVar23 = ((int)uVar25 >> 0x1e) + ((uVar3 ^ local_64) - local_64);
    uVar3 = ((int)uVar23 >> 0x1e) + ((uVar8 ^ local_64) - local_64);
    uVar28 = ((int)uVar3 >> 0x1e) + (((uVar2 & local_5c) + uVar9 ^ local_64) - local_64);
    uVar9 = ((int)uVar28 >> 0x1e) + (((uVar2 & local_3c) + uVar15 ^ local_64) - local_64);
    uVar7 = ((int)uVar9 >> 0x1e) + (((uVar2 & local_40) + uVar13 ^ local_64) - local_64);
    uVar15 = ((int)uVar7 >> 0x1e) + ((uVar27 ^ local_64) - local_64);
    uVar13 = ((int)uVar15 >> 0x1e) + (((uVar2 & local_58) + uVar16 ^ local_64) - local_64);
    uVar27 = ((int)uVar13 >> 0x1e) + (((uVar2 & local_54) + local_34 ^ local_64) - local_64);
    uVar10 = (ulong)uVar27;
    local_68 = (int)uVar27 >> 0x1f;
    uVar25 = (uVar20 & local_68) + (uVar25 & 0x3fffffff);
    uVar2 = (local_40 & local_68) + (uVar7 & 0x3fffffff);
    uVar22 = (ulong)uVar2;
    uVar8 = (local_44 & local_68) + (uVar15 & 0x3fffffff);
    uVar18 = (ulong)uVar8;
    uVar7 = ((int)uVar25 >> 0x1e) + (local_38 & local_68) + (uVar23 & 0x3fffffff);
    uVar15 = ((int)uVar7 >> 0x1e) + (local_60 & local_68) + (uVar3 & 0x3fffffff);
    uVar16 = ((int)uVar15 >> 0x1e) + (local_5c & local_68) + (uVar28 & 0x3fffffff);
    uVar20 = ((int)uVar16 >> 0x1e) + (local_3c & local_68) + (uVar9 & 0x3fffffff);
    uVar2 = ((int)uVar20 >> 0x1e) + uVar2;
    uVar8 = ((int)uVar2 >> 0x1e) + uVar8;
    uVar9 = ((int)uVar8 >> 0x1e) + (local_58 & local_68) + (uVar13 & 0x3fffffff);
    uVar13 = ((int)uVar9 >> 0x1e) + (local_54 & local_68) + uVar27;
    uVar14 = (ulong)uVar13;
    uVar16 = uVar16 & 0x3fffffff;
    psVar17 = (secp256k1_fe *)(ulong)uVar16;
    uVar20 = uVar20 & 0x3fffffff;
    psVar21 = (secp256k1_modinv32_signed30 *)(ulong)uVar20;
    uVar9 = uVar9 & 0x3fffffff;
    uVar6 = (ulong)uVar9;
    r->v[0] = uVar25 & 0x3fffffff;
    r->v[1] = uVar7 & 0x3fffffff;
    r->v[2] = uVar15 & 0x3fffffff;
    r->v[3] = uVar16;
    r->v[4] = uVar20;
    r->v[5] = uVar2 & 0x3fffffff;
    r->v[6] = uVar8 & 0x3fffffff;
    r->v[7] = uVar9;
    r->v[8] = uVar13;
    if (0x3fffffff < uVar13) goto LAB_0014c0a0;
    psVar17 = (secp256k1_fe *)0x9;
    pcStack_70 = (code *)0x14c05e;
    psVar21 = r;
    iVar1 = secp256k1_modinv32_mul_cmp_30(r,9,&local_50->modulus,0);
    if (iVar1 < 0) goto LAB_0014c0a5;
    psVar17 = (secp256k1_fe *)0x9;
    pcStack_70 = (code *)0x14c079;
    psVar21 = r;
    iVar1 = secp256k1_modinv32_mul_cmp_30(r,9,&local_50->modulus,1);
    if (iVar1 < 0) {
      return;
    }
  }
  pcStack_70 = test_inverse_field;
  secp256k1_modinv32_normalize_30_cold_1();
  r_00 = &sStack_130;
  psVar12 = &sStack_130;
  pcVar26 = secp256k1_fe_inv_var;
  if (extraout_EDX == 0) {
    pcVar26 = secp256k1_fe_inv;
  }
  pcStack_138 = (code *)0x14c0e0;
  uStack_98 = uVar6;
  uStack_90 = uVar10;
  uStack_88 = uVar18;
  psStack_80 = r;
  uStack_78 = uVar22;
  pcStack_70 = (code *)uVar14;
  (*pcVar26)(&sStack_130);
  if (psVar21 != (secp256k1_modinv32_signed30 *)0x0) {
    *(uint64_t *)(psVar21->v + 8) = sStack_130.n[4];
    *(ulong *)(psVar21[1].v + 1) = CONCAT44(sStack_130.normalized,sStack_130.magnitude);
    *(uint64_t *)(psVar21->v + 4) = sStack_130.n[2];
    *(uint64_t *)(psVar21->v + 6) = sStack_130.n[3];
    *(uint64_t *)psVar21->v = sStack_130.n[0];
    *(uint64_t *)(psVar21->v + 2) = sStack_130.n[1];
  }
  uVar14 = 0xffffffffffff;
  sStack_d0.n[0] = psVar17->n[0];
  sStack_d0.n[1] = psVar17->n[1];
  sStack_d0.n[2] = psVar17->n[2];
  sStack_d0.n[3] = psVar17->n[3];
  sStack_d0.n[4] = psVar17->n[4];
  sStack_d0.magnitude = psVar17->magnitude;
  sStack_d0.normalized = psVar17->normalized;
  psVar19 = &sStack_d0;
  pcStack_138 = (code *)0x14c149;
  secp256k1_fe_verify(psVar19);
  uVar6 = (sStack_d0.n[4] >> 0x30) * 0x1000003d1 + sStack_d0.n[0];
  if (((uVar6 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar6 & 0xfffffffffffff) == 0)) {
    uVar10 = (uVar6 >> 0x34) + sStack_d0.n[1];
    uVar18 = (uVar10 >> 0x34) + sStack_d0.n[2];
    uVar22 = (uVar18 >> 0x34) + sStack_d0.n[3];
    uVar24 = (uVar22 >> 0x34) + (sStack_d0.n[4] & 0xffffffffffff);
    if ((((uVar10 | uVar6 | uVar18 | uVar22) & 0xfffffffffffff) != 0 || uVar24 != 0) &&
       (((uVar6 | 0x1000003d0) & uVar10 & uVar18 & uVar22 & (uVar24 ^ 0xf000000000000)) !=
        0xfffffffffffff)) goto LAB_0014c1f0;
LAB_0014c5ba:
    pcStack_138 = (code *)0x14c5c5;
    secp256k1_fe_verify(&sStack_130);
    uVar14 = sStack_130.n[4] & 0xffffffffffff;
    uVar6 = (sStack_130.n[4] >> 0x30) * 0x1000003d1 + sStack_130.n[0];
    uVar10 = (uVar6 >> 0x34) + sStack_130.n[1];
    uVar18 = (uVar10 >> 0x34) + sStack_130.n[2];
    r_00 = (secp256k1_fe *)((uVar18 >> 0x34) + sStack_130.n[3]);
    uVar22 = ((ulong)r_00 >> 0x34) + uVar14;
    if ((((uVar10 | uVar6 | uVar18 | (ulong)r_00) & 0xfffffffffffff) == 0 && uVar22 == 0) ||
       (r_01 = (secp256k1_fe *)(uVar22 ^ 0xf000000000000), psVar12 = &sStack_130,
       ((uVar6 ^ 0x1000003d0) & uVar10 & uVar18 & (ulong)r_00 & (ulong)r_01) == 0xfffffffffffff)) {
      return;
    }
  }
  else {
LAB_0014c1f0:
    pcStack_138 = (code *)0x14c203;
    psVar19 = psVar17;
    secp256k1_fe_mul(&sStack_d0,psVar17,&sStack_130);
    pcStack_138 = (code *)0x14c20b;
    secp256k1_fe_verify(&sStack_d0);
    r_01 = &fe_minus_one;
    pcStack_138 = (code *)0x14c217;
    secp256k1_fe_verify(&fe_minus_one);
    if (sStack_d0.magnitude < 0x20) {
      sStack_d0.n[0] = sStack_d0.n[0] + 0xffffefffffc2e;
      sStack_d0.n[1] = sStack_d0.n[1] + 0xfffffffffffff;
      sStack_d0.n[2] = sStack_d0.n[2] + 0xfffffffffffff;
      sStack_d0.n[3] = sStack_d0.n[3] + 0xfffffffffffff;
      sStack_d0.n[4] = sStack_d0.n[4] + 0xffffffffffff;
      sStack_d0.normalized = 0;
      sStack_d0.magnitude = sStack_d0.magnitude + 1;
      pcStack_138 = (code *)0x14c269;
      secp256k1_fe_verify(&sStack_d0);
      pcStack_138 = (code *)0x14c271;
      secp256k1_fe_verify(&sStack_d0);
      uVar6 = (sStack_d0.n[4] >> 0x30) * 0x1000003d1 + sStack_d0.n[0];
      uVar10 = (uVar6 >> 0x34) + sStack_d0.n[1];
      uVar18 = (uVar10 >> 0x34) + sStack_d0.n[2];
      psVar19 = (secp256k1_fe *)((uVar18 >> 0x34) + sStack_d0.n[3]);
      uVar22 = ((ulong)psVar19 >> 0x34) + (sStack_d0.n[4] & 0xffffffffffff);
      if ((((uVar10 | uVar6 | uVar18 | (ulong)psVar19) & 0xfffffffffffff) != 0 || uVar22 != 0) &&
         (r_01 = (secp256k1_fe *)(uVar22 ^ 0xf000000000000),
         ((uVar6 ^ 0x1000003d0) & uVar10 & uVar18 & (ulong)psVar19 & (ulong)r_01) != 0xfffffffffffff
         )) goto LAB_0014c658;
      sStack_100.n[0] = psVar17->n[0];
      sStack_100.n[1] = psVar17->n[1];
      sStack_100.n[2] = psVar17->n[2];
      sStack_100.n[3] = psVar17->n[3];
      sStack_100.n[4] = psVar17->n[4];
      sStack_100.magnitude = psVar17->magnitude;
      sStack_100.normalized = psVar17->normalized;
      psVar17 = &sStack_100;
      pcStack_138 = (code *)0x14c317;
      secp256k1_fe_verify(psVar17);
      r_01 = &fe_minus_one;
      pcStack_138 = (code *)0x14c323;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_100.magnitude) goto LAB_0014c65d;
      sStack_100.n[0] = sStack_100.n[0] + 0xffffefffffc2e;
      sStack_100.n[1] = sStack_100.n[1] + 0xfffffffffffff;
      sStack_100.n[2] = sStack_100.n[2] + 0xfffffffffffff;
      sStack_100.n[3] = sStack_100.n[3] + 0xfffffffffffff;
      sStack_100.n[4] = sStack_100.n[4] + 0xffffffffffff;
      sStack_100.normalized = 0;
      sStack_100.magnitude = sStack_100.magnitude + 1;
      pcStack_138 = (code *)0x14c36e;
      secp256k1_fe_verify(&sStack_100);
      pcStack_138 = (code *)0x14c376;
      secp256k1_fe_verify(&sStack_100);
      uVar6 = (sStack_100.n[4] >> 0x30) * 0x1000003d1 + sStack_100.n[0];
      if (((uVar6 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar6 & 0xfffffffffffff) == 0)) {
        uVar10 = (uVar6 >> 0x34) + sStack_100.n[1];
        uVar18 = (uVar10 >> 0x34) + sStack_100.n[2];
        uVar22 = (uVar18 >> 0x34) + sStack_100.n[3];
        uVar24 = (uVar22 >> 0x34) + (sStack_100.n[4] & 0xffffffffffff);
        if (((uVar10 | uVar6 | uVar18 | uVar22) & 0xfffffffffffff) == 0 && uVar24 == 0) {
          return;
        }
        if (((uVar6 | 0x1000003d0) & uVar10 & uVar18 & uVar22 & (uVar24 ^ 0xf000000000000)) ==
            0xfffffffffffff) {
          return;
        }
      }
      psVar19 = &sStack_100;
      pcStack_138 = (code *)0x14c425;
      (*pcVar26)();
      pcStack_138 = (code *)0x14c430;
      secp256k1_fe_verify(&sStack_130);
      r_01 = &fe_minus_one;
      pcStack_138 = (code *)0x14c43c;
      secp256k1_fe_verify(&fe_minus_one);
      psVar17 = &sStack_130;
      if (0x1f < sStack_130.magnitude) goto LAB_0014c662;
      sStack_130.n[0] = sStack_130.n[0] + 0xffffefffffc2e;
      sStack_130.n[1] = sStack_130.n[1] + 0xfffffffffffff;
      sStack_130.n[2] = sStack_130.n[2] + 0xfffffffffffff;
      sStack_130.n[3] = sStack_130.n[3] + 0xfffffffffffff;
      sStack_130.n[4] = sStack_130.n[4] + 0xffffffffffff;
      sStack_130.magnitude = sStack_130.magnitude + 1;
      sStack_130.normalized = 0;
      pcStack_138 = (code *)0x14c485;
      secp256k1_fe_verify(&sStack_130);
      pcStack_138 = (code *)0x14c48e;
      (*pcVar26)(&sStack_130);
      pcStack_138 = (code *)0x14c496;
      secp256k1_fe_verify(&sStack_130);
      sStack_130.n[0] = sStack_130.n[0] + 1;
      sStack_130.magnitude = sStack_130.magnitude + 1;
      sStack_130.normalized = 0;
      pcStack_138 = (code *)0x14c4a8;
      secp256k1_fe_verify(&sStack_130);
      pcStack_138 = (code *)0x14c4b0;
      secp256k1_fe_verify(&sStack_130);
      psVar19 = &sStack_100;
      pcStack_138 = (code *)0x14c4bd;
      r_01 = psVar19;
      secp256k1_fe_verify(psVar19);
      if (sStack_100.magnitude + sStack_130.magnitude < 0x21) {
        sStack_130.n[0] = sStack_130.n[0] + sStack_100.n[0];
        sStack_130.n[1] = sStack_130.n[1] + sStack_100.n[1];
        sStack_130.n[2] = sStack_130.n[2] + sStack_100.n[2];
        sStack_130.n[3] = sStack_130.n[3] + sStack_100.n[3];
        sStack_130.n[4] = sStack_130.n[4] + sStack_100.n[4];
        sStack_130.normalized = 0;
        pcStack_138 = (code *)0x14c509;
        sStack_130.magnitude = sStack_100.magnitude + sStack_130.magnitude;
        secp256k1_fe_verify(&sStack_130);
        pcStack_138 = (code *)0x14c511;
        secp256k1_fe_verify(&sStack_130);
        uVar6 = (sStack_130.n[4] >> 0x30) * 0x1000003d1 + sStack_130.n[0];
        if (((uVar6 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar6 & 0xfffffffffffff) == 0)) {
          uVar14 = (uVar6 >> 0x34) + sStack_130.n[1];
          uVar10 = (uVar14 >> 0x34) + sStack_130.n[2];
          uVar18 = (uVar10 >> 0x34) + sStack_130.n[3];
          uVar22 = (uVar18 >> 0x34) + (sStack_130.n[4] & 0xffffffffffff);
          if (((uVar14 | uVar6 | uVar10 | uVar18) & 0xfffffffffffff) == 0 && uVar22 == 0) {
            return;
          }
          if (((uVar6 | 0x1000003d0) & uVar14 & uVar10 & uVar18 & (uVar22 ^ 0xf000000000000)) ==
              0xfffffffffffff) {
            return;
          }
        }
        pcStack_138 = (code *)0x14c5ba;
        test_inverse_field_cold_2();
        goto LAB_0014c5ba;
      }
    }
    else {
      pcStack_138 = (code *)0x14c658;
      test_inverse_field_cold_7();
LAB_0014c658:
      pcStack_138 = (code *)0x14c65d;
      test_inverse_field_cold_6();
LAB_0014c65d:
      pcStack_138 = (code *)0x14c662;
      test_inverse_field_cold_5();
LAB_0014c662:
      r_00 = psVar19;
      psVar12 = psVar17;
      psVar19 = &sStack_d0;
      pcStack_138 = (code *)0x14c667;
      test_inverse_field_cold_4();
    }
    pcStack_138 = (code *)0x14c66c;
    test_inverse_field_cold_3();
  }
  pcStack_138 = test_inverse_scalar;
  test_inverse_field_cold_1();
  pcStack_138 = (code *)0xfffffffffffff;
  psVar17 = (secp256k1_fe *)auStack_1a8;
  pcVar29 = secp256k1_scalar_inverse_var;
  if (extraout_EDX_00 == 0) {
    pcVar29 = secp256k1_scalar_inverse;
  }
  pcStack_1b0 = (code *)0x14c69a;
  auStack_168._32_8_ = psVar12;
  auStack_168._40_8_ = psVar19;
  (*pcVar29)(auStack_1a8);
  if (r_01 != (secp256k1_fe *)0x0) {
    r_01->n[2] = CONCAT44(auStack_1a8._20_4_,auStack_1a8._16_4_);
    r_01->n[3] = CONCAT44(auStack_1a8._28_4_,auStack_1a8._24_4_);
    r_01->n[0] = CONCAT44(auStack_1a8._4_4_,auStack_1a8._0_4_);
    r_01->n[1] = CONCAT44(auStack_1a8._12_4_,auStack_1a8._8_4_);
  }
  pcStack_1b0 = (code *)0x14c6b9;
  secp256k1_scalar_verify((secp256k1_scalar *)r_00);
  auVar30._0_4_ = -(uint)((int)r_00->n[2] == 0 && (int)r_00->n[0] == 0);
  auVar30._4_4_ = -(uint)(*(int *)((long)r_00->n + 0x14) == 0 && *(int *)((long)r_00->n + 4) == 0);
  auVar30._8_4_ = -(uint)((int)r_00->n[3] == 0 && (int)r_00->n[1] == 0);
  auVar30._12_4_ =
       -(uint)(*(int *)((long)r_00->n + 0x1c) == 0 && *(int *)((long)r_00->n + 0xc) == 0);
  iVar1 = movmskps(extraout_EAX,auVar30);
  if (iVar1 != 0xf) {
    r_01 = (secp256k1_fe *)auStack_168;
    pcStack_1b0 = (code *)0x14c6ed;
    secp256k1_scalar_mul
              ((secp256k1_scalar *)r_01,(secp256k1_scalar *)r_00,(secp256k1_scalar *)auStack_1a8);
    pcStack_1b0 = (code *)0x14c6f5;
    psVar12 = r_01;
    secp256k1_scalar_verify((secp256k1_scalar *)r_01);
    if (((auStack_168._0_8_ != 1 || auStack_168._8_8_ != 0) || auStack_168._16_8_ != 0) ||
        auStack_168._24_8_ != 0) {
      pcStack_1b0 = (code *)0x14c7ff;
      test_inverse_scalar_cold_1();
      goto LAB_0014c7ff;
    }
    pcStack_1b0 = (code *)0x14c725;
    secp256k1_scalar_add
              ((secp256k1_scalar *)(auStack_1a8 + 0x20),(secp256k1_scalar *)r_00,&scalar_minus_one);
    pcStack_1b0 = (code *)0x14c72d;
    secp256k1_scalar_verify((secp256k1_scalar *)(auStack_1a8 + 0x20));
    auVar31._0_4_ = -(uint)(iStack_178 == 0 && auStack_1a8._32_4_ == 0);
    auVar31._4_4_ = -(uint)(iStack_174 == 0 && iStack_184 == 0);
    auVar31._8_4_ = -(uint)(iStack_170 == 0 && iStack_180 == 0);
    auVar31._12_4_ = -(uint)(iStack_16c == 0 && iStack_17c == 0);
    iVar1 = movmskps(extraout_EAX_00,auVar31);
    if (iVar1 == 0xf) {
      return;
    }
    a = (secp256k1_scalar *)(auStack_1a8 + 0x20);
    pcStack_1b0 = (code *)0x14c75e;
    (*pcVar29)(a,a);
    pcStack_1b0 = (code *)0x14c773;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_1a8,&scalar_minus_one,(secp256k1_scalar *)auStack_1a8);
    pcStack_1b0 = (code *)0x14c77c;
    (*pcVar29)(auStack_1a8,auStack_1a8);
    pcStack_1b0 = (code *)0x14c78e;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_1a8,(secp256k1_scalar *)auStack_1a8,&secp256k1_scalar_one
              );
    pcStack_1b0 = (code *)0x14c79c;
    secp256k1_scalar_add((secp256k1_scalar *)auStack_1a8,a,(secp256k1_scalar *)auStack_1a8);
    pcStack_1b0 = (code *)0x14c7a4;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_1a8);
    auVar32._0_4_ = -(uint)(auStack_1a8._16_4_ == 0 && auStack_1a8._0_4_ == 0);
    auVar32._4_4_ = -(uint)(auStack_1a8._20_4_ == 0 && auStack_1a8._4_4_ == 0);
    auVar32._8_4_ = -(uint)(auStack_1a8._24_4_ == 0 && auStack_1a8._8_4_ == 0);
    auVar32._12_4_ = -(uint)(auStack_1a8._28_4_ == 0 && auStack_1a8._12_4_ == 0);
    iVar1 = movmskps(extraout_EAX_01,auVar32);
    if (iVar1 == 0xf) {
      return;
    }
    pcStack_1b0 = (code *)0x14c7c8;
    test_inverse_scalar_cold_2();
    r_01 = (secp256k1_fe *)auStack_1a8;
  }
  pcStack_1b0 = (code *)0x14c7d3;
  secp256k1_scalar_verify((secp256k1_scalar *)auStack_1a8);
  auVar33._0_4_ = -(uint)(auStack_1a8._16_4_ == 0 && auStack_1a8._0_4_ == 0);
  auVar33._4_4_ = -(uint)(auStack_1a8._20_4_ == 0 && auStack_1a8._4_4_ == 0);
  auVar33._8_4_ = -(uint)(auStack_1a8._24_4_ == 0 && auStack_1a8._8_4_ == 0);
  auVar33._12_4_ = -(uint)(auStack_1a8._28_4_ == 0 && auStack_1a8._12_4_ == 0);
  iVar1 = movmskps(extraout_EAX_02,auVar33);
  r_00 = (secp256k1_fe *)auStack_1a8;
  psVar12 = psVar17;
  if (iVar1 == 0xf) {
    return;
  }
LAB_0014c7ff:
  pcStack_1b0 = test_hsort;
  test_inverse_scalar_cold_3();
  uStack_1c8 = 0x1000003d1;
  __s = auStack_1260;
  psStack_1d8 = r_00;
  pcStack_1d0 = pcVar26;
  psStack_1c0 = r_01;
  pcStack_1b8 = pcVar29;
  pcStack_1b0 = (code *)uVar14;
  memset(__s,0,0x1081);
  uStack_1270 = 0;
  lVar5 = 0x41;
  psStack_1268 = psVar12;
  secp256k1_hsort(__s,0x41,(size_t)psVar12,test_hsort_cmp,&uStack_1270);
  if (0x3f < uStack_1270) {
    test_hsort_is_sorted(auStack_1260,0x41,(size_t)psVar12);
    if (0 < COUNT) {
      iVar1 = 0;
      do {
        uVar4 = testrand_int(0x41);
        count = (size_t)(int)uVar4;
        testrand_bytes_test(auStack_1260,count * (long)psVar12);
        secp256k1_hsort(auStack_1260,count,(size_t)psVar12,test_hsort_cmp,&uStack_1270);
        test_hsort_is_sorted(auStack_1260,count,(size_t)psVar12);
        iVar1 = iVar1 + 1;
      } while (iVar1 < COUNT);
    }
    return;
  }
  test_hsort_cold_1();
  *extraout_RDX = *extraout_RDX + 1;
  if (extraout_RDX[1] != 0) {
    lVar11 = 0;
    do {
      if (__s[lVar11] != *(uchar *)(lVar5 + lVar11)) {
        return;
      }
      lVar11 = lVar11 + 1;
    } while (extraout_RDX[1] != lVar11);
  }
  return;
}

Assistant:

static void secp256k1_modinv32_normalize_30(secp256k1_modinv32_signed30 *r, int32_t sign, const secp256k1_modinv32_modinfo *modinfo) {
    const int32_t M30 = (int32_t)(UINT32_MAX >> 2);
    int32_t r0 = r->v[0], r1 = r->v[1], r2 = r->v[2], r3 = r->v[3], r4 = r->v[4],
            r5 = r->v[5], r6 = r->v[6], r7 = r->v[7], r8 = r->v[8];
    volatile int32_t cond_add, cond_negate;

#ifdef VERIFY
    /* Verify that all limbs are in range (-2^30,2^30). */
    int i;
    for (i = 0; i < 9; ++i) {
        VERIFY_CHECK(r->v[i] >= -M30);
        VERIFY_CHECK(r->v[i] <= M30);
    }
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(r, 9, &modinfo->modulus, -2) > 0); /* r > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(r, 9, &modinfo->modulus, 1) < 0); /* r < modulus */
#endif

    /* In a first step, add the modulus if the input is negative, and then negate if requested.
     * This brings r from range (-2*modulus,modulus) to range (-modulus,modulus). As all input
     * limbs are in range (-2^30,2^30), this cannot overflow an int32_t. Note that the right
     * shifts below are signed sign-extending shifts (see assumptions.h for tests that that is
     * indeed the behavior of the right shift operator). */
    cond_add = r8 >> 31;
    r0 += modinfo->modulus.v[0] & cond_add;
    r1 += modinfo->modulus.v[1] & cond_add;
    r2 += modinfo->modulus.v[2] & cond_add;
    r3 += modinfo->modulus.v[3] & cond_add;
    r4 += modinfo->modulus.v[4] & cond_add;
    r5 += modinfo->modulus.v[5] & cond_add;
    r6 += modinfo->modulus.v[6] & cond_add;
    r7 += modinfo->modulus.v[7] & cond_add;
    r8 += modinfo->modulus.v[8] & cond_add;
    cond_negate = sign >> 31;
    r0 = (r0 ^ cond_negate) - cond_negate;
    r1 = (r1 ^ cond_negate) - cond_negate;
    r2 = (r2 ^ cond_negate) - cond_negate;
    r3 = (r3 ^ cond_negate) - cond_negate;
    r4 = (r4 ^ cond_negate) - cond_negate;
    r5 = (r5 ^ cond_negate) - cond_negate;
    r6 = (r6 ^ cond_negate) - cond_negate;
    r7 = (r7 ^ cond_negate) - cond_negate;
    r8 = (r8 ^ cond_negate) - cond_negate;
    /* Propagate the top bits, to bring limbs back to range (-2^30,2^30). */
    r1 += r0 >> 30; r0 &= M30;
    r2 += r1 >> 30; r1 &= M30;
    r3 += r2 >> 30; r2 &= M30;
    r4 += r3 >> 30; r3 &= M30;
    r5 += r4 >> 30; r4 &= M30;
    r6 += r5 >> 30; r5 &= M30;
    r7 += r6 >> 30; r6 &= M30;
    r8 += r7 >> 30; r7 &= M30;

    /* In a second step add the modulus again if the result is still negative, bringing r to range
     * [0,modulus). */
    cond_add = r8 >> 31;
    r0 += modinfo->modulus.v[0] & cond_add;
    r1 += modinfo->modulus.v[1] & cond_add;
    r2 += modinfo->modulus.v[2] & cond_add;
    r3 += modinfo->modulus.v[3] & cond_add;
    r4 += modinfo->modulus.v[4] & cond_add;
    r5 += modinfo->modulus.v[5] & cond_add;
    r6 += modinfo->modulus.v[6] & cond_add;
    r7 += modinfo->modulus.v[7] & cond_add;
    r8 += modinfo->modulus.v[8] & cond_add;
    /* And propagate again. */
    r1 += r0 >> 30; r0 &= M30;
    r2 += r1 >> 30; r1 &= M30;
    r3 += r2 >> 30; r2 &= M30;
    r4 += r3 >> 30; r3 &= M30;
    r5 += r4 >> 30; r4 &= M30;
    r6 += r5 >> 30; r5 &= M30;
    r7 += r6 >> 30; r6 &= M30;
    r8 += r7 >> 30; r7 &= M30;

    r->v[0] = r0;
    r->v[1] = r1;
    r->v[2] = r2;
    r->v[3] = r3;
    r->v[4] = r4;
    r->v[5] = r5;
    r->v[6] = r6;
    r->v[7] = r7;
    r->v[8] = r8;

    VERIFY_CHECK(r0 >> 30 == 0);
    VERIFY_CHECK(r1 >> 30 == 0);
    VERIFY_CHECK(r2 >> 30 == 0);
    VERIFY_CHECK(r3 >> 30 == 0);
    VERIFY_CHECK(r4 >> 30 == 0);
    VERIFY_CHECK(r5 >> 30 == 0);
    VERIFY_CHECK(r6 >> 30 == 0);
    VERIFY_CHECK(r7 >> 30 == 0);
    VERIFY_CHECK(r8 >> 30 == 0);
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(r, 9, &modinfo->modulus, 0) >= 0); /* r >= 0 */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(r, 9, &modinfo->modulus, 1) < 0); /* r < modulus */
}